

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O1

uint aom_highbd_10_variance8x8_c(uint8_t *a,int a_stride,uint8_t *b,int b_stride,uint32_t *sse)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  int j;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  lVar3 = (long)b * 2;
  lVar5 = (long)a * 2;
  iVar8 = 0;
  lVar6 = 0;
  lVar2 = 0;
  do {
    lVar4 = 0;
    iVar9 = 0;
    do {
      iVar10 = (uint)*(ushort *)(lVar5 + lVar4 * 2) - (uint)*(ushort *)(lVar3 + lVar4 * 2);
      iVar9 = iVar9 + iVar10;
      lVar6 = lVar6 + (ulong)(uint)(iVar10 * iVar10);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    lVar2 = lVar2 + iVar9;
    iVar8 = iVar8 + 1;
    lVar3 = lVar3 + (long)b_stride * 2;
    lVar5 = lVar5 + (long)a_stride * 2;
  } while (iVar8 != 8);
  uVar7 = lVar6 + 8U >> 4;
  *sse = (uint32_t)uVar7;
  lVar3 = lVar2 * 0x40000000 + 0x80000000 >> 0x20;
  lVar3 = (uVar7 & 0xffffffff) - ((ulong)(lVar3 * lVar3) >> 6);
  uVar1 = (uint)lVar3;
  if (lVar3 < 0) {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static void highbd_variance64(const uint8_t *a8, int a_stride,
                              const uint8_t *b8, int b_stride, int w, int h,
                              uint64_t *sse, int64_t *sum) {
  const uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  int64_t tsum = 0;
  uint64_t tsse = 0;
  for (int i = 0; i < h; ++i) {
    int32_t lsum = 0;
    for (int j = 0; j < w; ++j) {
      const int diff = a[j] - b[j];
      lsum += diff;
      tsse += (uint32_t)(diff * diff);
    }
    tsum += lsum;
    a += a_stride;
    b += b_stride;
  }
  *sum = tsum;
  *sse = tsse;
}